

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nodeRowidIndex(Rtree *pRtree,RtreeNode *pNode,i64 iRowid,int *piIndex)

{
  byte bVar1;
  ushort uVar2;
  i64 iVar3;
  ulong uVar4;
  u8 *p;
  
  uVar2 = *(ushort *)(pNode->zData + 2);
  uVar2 = uVar2 << 8 | uVar2 >> 8;
  if (uVar2 != 0) {
    p = pNode->zData + 4;
    bVar1 = pRtree->nBytesPerCell;
    uVar4 = 0;
    do {
      iVar3 = readInt64(p);
      if (iVar3 == iRowid) {
        *piIndex = (int)uVar4;
        return 0;
      }
      uVar4 = uVar4 + 1;
      p = p + bVar1;
    } while (uVar2 != uVar4);
  }
  return 0x10b;
}

Assistant:

static int nodeRowidIndex(
  Rtree *pRtree, 
  RtreeNode *pNode, 
  i64 iRowid,
  int *piIndex
){
  int ii;
  int nCell = NCELL(pNode);
  assert( nCell<200 );
  for(ii=0; ii<nCell; ii++){
    if( nodeGetRowid(pRtree, pNode, ii)==iRowid ){
      *piIndex = ii;
      return SQLITE_OK;
    }
  }
  RTREE_IS_CORRUPT(pRtree);
  return SQLITE_CORRUPT_VTAB;
}